

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O0

int ncnn::conv3x3s1_winograd23(Mat *bottom_blob,Mat *top_blob,Mat *AT,Mat *bias,int nT,Option *opt)

{
  int *piVar1;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  long in_R9;
  int in_stack_00000124;
  int in_stack_00000128;
  int in_stack_0000012c;
  Mat *in_stack_00000130;
  Mat *in_stack_00000138;
  Mat *in_stack_00000140;
  Mat BT_tile_2;
  Mat AT_tile;
  int max_kk_2;
  int k_2;
  int max_jj_2;
  int j_2;
  int max_ii;
  Mat top_tile;
  int i;
  int ppj_2;
  Mat top_tileX;
  Mat BT_tile_1;
  Mat B_tile_1;
  int max_kk_1;
  int max_jj_1;
  int k_1;
  int j_1;
  int ppk_1;
  int ppj_1;
  int ppjk_1;
  Mat B_tileX;
  Mat BT_tile;
  int max_kk;
  int max_jj;
  int k;
  int j;
  int ppk;
  int ppj;
  int ppjk;
  Mat B_tile;
  int nn_NK;
  Mat BT;
  int nn_K;
  int nn_N;
  int nn_M;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  int B;
  int K;
  int N;
  int M;
  int tiles;
  int h_tiles;
  int w_tiles;
  int outh;
  int outw;
  int in_stack_000008e0;
  int in_stack_000008e4;
  int in_stack_000008e8;
  int in_stack_000008ec;
  Mat *in_stack_000008f0;
  Mat *in_stack_000008f8;
  Mat *m_5;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Mat *m_4;
  int in_stack_00000f14;
  int in_stack_00000f18;
  int in_stack_00000f1c;
  Mat *in_stack_00000f20;
  Mat *in_stack_00000f28;
  Mat *in_stack_00000f30;
  int in_stack_fffffffffffff070;
  int in_stack_fffffffffffff078;
  undefined4 in_stack_fffffffffffff07c;
  int in_stack_fffffffffffff080;
  int in_stack_fffffffffffff084;
  size_t in_stack_fffffffffffff088;
  void **ppvVar2;
  undefined4 in_stack_fffffffffffff090;
  int in_stack_fffffffffffff094;
  undefined8 in_stack_fffffffffffff098;
  Mat *in_stack_fffffffffffff0a0;
  int *in_stack_fffffffffffff0c0;
  int *in_stack_fffffffffffff0c8;
  int *in_stack_fffffffffffff0d0;
  undefined8 in_stack_fffffffffffff0d8;
  undefined8 in_stack_fffffffffffff0e0;
  Allocator *in_stack_fffffffffffff0f0;
  bool local_ea1;
  bool local_e09;
  bool local_d99;
  bool local_d71;
  undefined8 local_d70;
  undefined8 local_d68;
  undefined8 local_d60;
  undefined4 local_d58;
  long *local_d50;
  undefined4 local_d48;
  undefined4 local_d44;
  undefined4 local_d40;
  undefined4 local_d3c;
  undefined4 local_d38;
  undefined8 local_d30;
  void *local_d28;
  int *local_d20;
  long local_d18;
  undefined4 local_d10;
  long *local_d08;
  undefined4 local_d00;
  int local_cfc;
  int local_cf8;
  undefined4 local_cf4;
  undefined4 local_cf0;
  long local_ce8;
  undefined8 local_ce0;
  undefined8 local_cd8;
  undefined8 local_cd0;
  undefined4 local_cc8;
  long *local_cc0;
  undefined4 local_cb8;
  undefined4 local_cb4;
  undefined4 local_cb0;
  undefined4 local_cac;
  undefined4 local_ca8;
  undefined8 local_ca0;
  void *local_c98;
  int *local_c90;
  long local_c88;
  undefined4 local_c80;
  long *local_c78;
  undefined4 local_c70;
  int local_c6c;
  int local_c68;
  undefined4 local_c64;
  undefined4 local_c60;
  long local_c58;
  int local_c50;
  int local_c4c;
  int local_c48;
  int local_c44;
  int local_c40;
  int local_c3c;
  int local_c38;
  int local_c34;
  void *local_c30;
  int *local_c28;
  ulong local_c20;
  undefined4 local_c18;
  long *local_c10;
  int local_c08;
  int local_c04;
  int local_c00;
  undefined4 local_bfc;
  undefined4 local_bf8;
  ulong local_bf0;
  int local_be8;
  int local_be4;
  void *local_be0;
  int *local_bd8;
  ulong local_bd0;
  undefined4 local_bc8;
  long *local_bc0;
  int local_bb8;
  int local_bb4;
  int local_bb0;
  undefined4 local_bac;
  int local_ba8;
  long local_ba0;
  undefined8 local_b98;
  undefined8 local_b90;
  undefined8 local_b88;
  undefined4 local_b80;
  long *local_b78;
  undefined4 local_b70;
  undefined4 local_b6c;
  undefined4 local_b68;
  undefined4 local_b64;
  undefined4 local_b60;
  undefined8 local_b58;
  void *local_b50;
  int *local_b48;
  long local_b40;
  undefined4 local_b38;
  long *local_b30;
  undefined4 local_b28;
  int local_b24;
  int local_b20;
  undefined4 local_b1c;
  undefined4 local_b18;
  long local_b10;
  void *local_b08;
  int *local_b00;
  ulong local_af8;
  undefined4 local_af0;
  long *local_ae8;
  int local_ae0;
  int local_adc;
  int local_ad8;
  undefined4 local_ad4;
  undefined4 local_ad0;
  ulong local_ac8;
  int local_abc;
  int local_ab8;
  int local_ab4;
  int local_ab0;
  int local_aac;
  int local_aa8;
  int local_aa4;
  int local_aa0;
  int local_a9c;
  void *local_a98;
  int *local_a90;
  ulong local_a88;
  undefined4 local_a80;
  long *local_a78;
  int local_a70;
  int local_a6c;
  int local_a68;
  undefined4 local_a64;
  int local_a60;
  long local_a58;
  undefined8 local_a50;
  undefined8 local_a48;
  undefined8 local_a40;
  undefined4 local_a38;
  long *local_a30;
  undefined4 local_a28;
  undefined4 local_a24;
  undefined4 local_a20;
  undefined4 local_a1c;
  undefined4 local_a18;
  undefined8 local_a10;
  void *local_a08;
  int *local_a00;
  long local_9f8;
  undefined4 local_9f0;
  long *local_9e8;
  undefined4 local_9e0;
  int local_9dc;
  int local_9d8;
  undefined4 local_9d4;
  undefined4 local_9d0;
  long local_9c8;
  int local_9bc;
  int local_9b8;
  int local_9b4;
  int local_9b0;
  int local_9ac;
  int local_9a8;
  int local_9a4;
  int local_9a0;
  int local_99c;
  void *local_998;
  int *local_990;
  undefined8 local_988;
  undefined4 local_980;
  long *local_978;
  undefined4 local_970;
  undefined4 local_96c;
  undefined4 local_968;
  undefined4 local_964;
  int local_960;
  long local_958;
  int local_94c;
  int local_948;
  void *local_938;
  int *local_930;
  long local_928;
  undefined4 local_920;
  long *local_918;
  undefined4 local_910;
  int local_90c;
  int local_908;
  undefined4 local_904;
  int local_900;
  long local_8f8;
  int local_8ec;
  int local_8e8;
  int local_8e4;
  int local_8e0;
  int local_8dc;
  int local_8d8;
  undefined4 local_8d4;
  int local_8d0;
  int local_8cc;
  int local_8c8;
  int local_8c4;
  int local_8c0;
  int local_8bc;
  int local_8b8;
  int local_8b4;
  long local_8b0;
  int local_8a4;
  long *local_898;
  int local_87c;
  undefined8 *local_878;
  void **local_868;
  void **local_858;
  undefined8 *local_848;
  void **local_838;
  void **local_828;
  void **local_818;
  undefined8 *local_808;
  undefined8 *local_7f8;
  void **local_7e8;
  void **local_7d8;
  void **local_7c8;
  void **local_7b8;
  void **local_7a8;
  int local_788;
  undefined4 local_784;
  void **local_780;
  int local_768;
  undefined4 local_764;
  void **local_760;
  int local_748;
  undefined4 local_744;
  void **local_740;
  int local_728;
  undefined4 local_724;
  void **local_720;
  int local_708;
  undefined4 local_704;
  void **local_700;
  undefined8 *local_6e0;
  undefined8 *local_6c0;
  int local_6a8;
  undefined4 local_6a4;
  void **local_6a0;
  int local_688;
  undefined4 local_684;
  void **local_680;
  int local_668;
  undefined4 local_664;
  void **local_660;
  undefined8 *local_640;
  int local_628;
  undefined4 local_624;
  void **local_620;
  int local_608;
  undefined4 local_604;
  void **local_600;
  undefined8 *local_5e0;
  void **local_5d8;
  void **local_5d0;
  void **local_5c8;
  void **local_5c0;
  undefined1 local_5b5;
  int local_5b4;
  void **local_5b0;
  undefined8 *local_5a8;
  undefined1 local_585;
  int local_584;
  void **local_580;
  void **local_578;
  undefined1 local_555;
  int local_554;
  void **local_550;
  undefined8 *local_548;
  undefined1 local_525;
  int local_524;
  void **local_520;
  void **local_518;
  undefined1 local_4f5;
  int local_4f4;
  void **local_4f0;
  undefined8 *local_4e8;
  undefined1 local_4c5;
  int local_4c4;
  undefined8 *local_4b8;
  void *local_458;
  void *local_448;
  void *local_428;
  void *local_418;
  void *local_408;
  void *local_3d8;
  void *local_3c8;
  void *local_3b8;
  void *local_3a8;
  void *local_398;
  undefined8 local_388;
  undefined8 local_380;
  int local_374;
  undefined4 local_370;
  int local_36c;
  void **local_368;
  undefined8 local_360;
  undefined8 local_358;
  undefined4 local_348;
  int local_344;
  void **local_340;
  int local_334;
  undefined8 *local_330;
  void **local_328;
  int local_31c;
  undefined8 *local_318;
  void **local_310;
  int local_304;
  undefined8 *local_300;
  void **local_2f8;
  long *local_2f0;
  undefined4 local_2e4;
  long local_2e0;
  void *local_2d8;
  int local_2d0;
  int local_2cc;
  void **local_2c8;
  long *local_2c0;
  undefined4 local_2b4;
  long local_2b0;
  void *local_2a8;
  int local_2a0;
  int local_29c;
  void **local_298;
  long *local_290;
  undefined4 local_284;
  long local_280;
  void *local_278;
  int local_270;
  int local_26c;
  void **local_268;
  void **local_260;
  void **local_258;
  void **local_250;
  void **local_248;
  undefined8 local_240;
  undefined8 local_238;
  int local_230;
  int local_22c;
  undefined4 local_228;
  int local_224;
  void **local_220;
  undefined8 local_218;
  undefined8 local_210;
  int local_204;
  void **local_200;
  int local_1f4;
  undefined8 *local_1f0;
  void **local_1e8;
  long *local_1e0;
  undefined4 local_1d4;
  long local_1d0;
  void *local_1c8;
  int local_1c0;
  int local_1bc;
  void **local_1b8;
  long *local_1b0;
  undefined4 local_1a4;
  long local_1a0;
  long local_198;
  undefined4 local_18c;
  int local_188;
  int local_184;
  undefined8 *local_180;
  long *local_178;
  undefined4 local_16c;
  long local_168;
  void *local_160;
  undefined4 local_154;
  int local_150;
  int local_14c;
  undefined8 *local_148;
  long *local_140;
  undefined4 local_134;
  ulong local_130;
  void *local_128;
  undefined4 local_11c;
  int local_118;
  int local_114;
  void **local_110;
  long *local_108;
  undefined4 local_fc;
  long local_f8;
  void *local_f0;
  undefined4 local_e4;
  int local_e0;
  int local_dc;
  undefined8 *local_d8;
  long *local_d0;
  undefined4 local_c4;
  undefined8 in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  
  local_8b4 = *(int *)(in_RSI + 0x2c);
  local_8b8 = *(int *)(in_RSI + 0x30);
  local_8bc = (local_8b4 + 1) / 2;
  local_8c0 = (local_8b8 + 1) / 2;
  local_8cc = local_8bc * local_8c0;
  local_8c8 = *(int *)(in_RSI + 0x38) * *(int *)(in_RSI + 0x18);
  local_8d0 = *(int *)(in_RDI + 0x38) * *(int *)(in_RDI + 0x18);
  local_8d4 = 0x10;
  local_8c4 = local_8cc;
  local_8b0 = in_R9;
  local_8a4 = in_R8D;
  local_898 = in_RDX;
  get_optimal_tile_mnk
            ((int)((ulong)in_stack_fffffffffffff0e0 >> 0x20),(int)in_stack_fffffffffffff0e0,
             (int)((ulong)in_stack_fffffffffffff0d8 >> 0x20),in_stack_fffffffffffff0d0,
             in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c0,(int)in_stack_fffffffffffff0f0);
  local_8e4 = (local_8c8 + local_8d8 + -1) / local_8d8;
  local_8e8 = (local_8cc + local_8dc + -1) / local_8dc;
  local_8ec = (local_8d0 + local_8e0 + -1) / local_8e0;
  local_224 = local_8e0 * local_8dc;
  local_22c = (local_8d0 + local_8e0 + -1) / local_8e0;
  local_230 = (local_8cc + local_8dc + -1) / local_8dc;
  local_240 = *(undefined8 *)(local_8b0 + 0x10);
  local_220 = &local_938;
  local_228 = 0x10;
  local_238 = 4;
  local_938 = (void *)0x0;
  local_930 = (int *)0x0;
  local_928 = 0;
  local_920 = 0;
  local_918 = (long *)0x0;
  local_910 = 0;
  local_90c = 0;
  local_908 = 0;
  local_904 = 0;
  local_900 = 0;
  local_8f8 = 0;
  Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff094,in_stack_fffffffffffff090),
              (int)(in_stack_fffffffffffff088 >> 0x20),(int)in_stack_fffffffffffff088,
              in_stack_fffffffffffff084,in_stack_fffffffffffff080,
              CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
              in_stack_fffffffffffff0f0);
  local_5c0 = &local_938;
  if (local_938 != (void *)0x0) {
    local_260 = local_5c0;
  }
  local_d71 = local_938 != (void *)0x0 && local_8f8 * local_900 != 0;
  if (local_d71) {
    local_94c = local_8e8 * local_8ec;
    if ((local_8a4 < 2) || (local_8a4 <= local_94c)) {
      local_36c = local_8dc * local_8e0 * 0x10;
      local_388 = *(undefined8 *)(local_8b0 + 0x10);
      local_368 = &local_a98;
      local_370 = 1;
      local_374 = local_8a4;
      local_380 = 4;
      local_a98 = (void *)0x0;
      local_a90 = (int *)0x0;
      local_a88 = 0;
      local_a80 = 0;
      local_a78 = (long *)0x0;
      local_a70 = 0;
      local_a6c = 0;
      local_a68 = 0;
      local_a64 = 0;
      local_a60 = 0;
      local_a58 = 0;
      Mat::create(in_stack_fffffffffffff0a0,(int)((ulong)in_stack_fffffffffffff098 >> 0x20),
                  (int)in_stack_fffffffffffff098,in_stack_fffffffffffff094,in_stack_fffffffffffff088
                  ,(Allocator *)CONCAT44(in_stack_fffffffffffff084,in_stack_fffffffffffff080));
      local_5d0 = &local_a98;
      if (local_a98 != (void *)0x0) {
        local_250 = local_5d0;
      }
      local_e09 = local_a98 != (void *)0x0 && local_a58 * local_a60 != 0;
      if (local_e09) {
        for (local_a9c = 0; local_a9c < local_94c; local_a9c = local_a9c + 1) {
          local_aa0 = local_a9c / local_8ec;
          local_aa4 = local_a9c % local_8ec;
          local_aa8 = local_aa0 * local_8dc;
          local_aac = local_aa4 * local_8e0;
          local_ab4 = local_8cc - local_aa8;
          piVar1 = std::min<int>(&local_ab4,&local_8dc);
          local_ab0 = *piVar1;
          local_abc = local_8d0 - local_aac;
          piVar1 = std::min<int>(&local_abc,&local_8e0);
          local_ab8 = *piVar1;
          local_524 = get_omp_thread_num();
          local_518 = &local_b08;
          local_520 = &local_a98;
          local_128 = (void *)((long)local_a98 + local_a58 * local_524 * local_a88);
          local_110 = &local_b08;
          local_b00 = (int *)0x0;
          local_af8 = local_a88;
          local_af0 = local_a80;
          local_ae8 = local_a78;
          local_adc = local_a6c;
          local_ad8 = local_a68;
          local_ad4 = 1;
          local_ad0 = local_a64;
          local_ac8 = ((long)local_a6c * (long)local_a68 * local_a88 + 0xf & 0xfffffffffffffff0) /
                      local_a88;
          local_ae0 = local_a70 + -1;
          if (local_a70 == 4) {
            local_ac8 = (long)local_a6c * (long)local_a68;
          }
          local_114 = local_a6c;
          local_118 = local_a68;
          local_11c = local_a64;
          local_130 = local_a88;
          local_134 = local_a80;
          local_140 = local_a78;
          local_525 = 1;
          local_b08 = local_128;
          conv3x3s1_winograd23_transform_input_tile
                    (in_stack_000008f8,in_stack_000008f0,in_stack_000008ec,in_stack_000008e8,
                     in_stack_000008e4,in_stack_000008e0,in_stack_fffffffffffff070);
          local_554 = local_aa8 / local_8dc;
          local_548 = &local_b98;
          local_550 = &local_938;
          local_f0 = (void *)((long)local_938 + local_8f8 * local_554 * local_928);
          local_d8 = &local_b98;
          local_31c = local_aac / local_8e0;
          local_310 = &local_b50;
          local_318 = &local_b98;
          local_2a8 = (void *)((long)local_f0 +
                              (long)local_90c * (long)local_908 * (long)local_31c * local_928);
          local_298 = &local_b50;
          local_b10 = (long)local_90c * (long)local_908;
          local_848 = &local_b98;
          local_b18 = 1;
          local_b1c = 1;
          local_b20 = local_908;
          local_b24 = local_90c;
          local_b28 = 2;
          local_b30 = local_918;
          local_b38 = local_920;
          local_b40 = local_928;
          local_b48 = (int *)0x0;
          local_b78 = local_918;
          local_dc = local_90c;
          local_e0 = local_908;
          local_e4 = local_904;
          local_f8 = local_928;
          local_fc = local_920;
          local_108 = local_918;
          local_29c = local_90c;
          local_2a0 = local_908;
          local_2b0 = local_928;
          local_2b4 = local_920;
          local_2c0 = local_918;
          local_555 = 1;
          local_b98 = 0;
          local_b88 = 0;
          local_b80 = 0;
          local_b70 = 0;
          local_b6c = 0;
          local_b68 = 0;
          local_b64 = 0;
          local_b60 = 0;
          local_b58 = 0;
          local_b90 = 0;
          local_640 = local_848;
          local_b50 = local_2a8;
          transpose_pack_B_tile
                    ((Mat *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                     (Mat *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),(int)in_stack_ffffffffffffff48,
                     (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),(int)in_stack_ffffffffffffff40)
          ;
          local_838 = &local_b50;
          local_660 = local_838;
          if (local_b48 != (int *)0x0) {
            local_664 = 0xffffffff;
            LOCK();
            local_668 = *local_b48;
            *local_b48 = *local_b48 + -1;
            UNLOCK();
            if (local_668 == 1) {
              if (local_b30 == (long *)0x0) {
                local_428 = local_b50;
                if (local_b50 != (void *)0x0) {
                  free(local_b50);
                }
              }
              else {
                (**(code **)(*local_b30 + 0x18))(local_b30,local_b50);
              }
            }
          }
          local_b50 = (void *)0x0;
          local_b40 = 0;
          local_b38 = 0;
          local_b28 = 0;
          local_b24 = 0;
          local_b20 = 0;
          local_b1c = 0;
          local_b18 = 0;
          local_b10 = 0;
          local_b48 = (int *)0x0;
          local_828 = &local_b08;
          local_680 = local_828;
          if (local_b00 != (int *)0x0) {
            local_684 = 0xffffffff;
            LOCK();
            local_688 = *local_b00;
            *local_b00 = *local_b00 + -1;
            UNLOCK();
            if (local_688 == 1) {
              if (local_ae8 == (long *)0x0) {
                local_418 = local_b08;
                if (local_b08 != (void *)0x0) {
                  free(local_b08);
                }
              }
              else {
                (**(code **)(*local_ae8 + 0x18))(local_ae8,local_b08);
              }
            }
          }
          local_b08 = (void *)0x0;
          local_af8 = 0;
          local_af0 = 0;
          local_ae0 = 0;
          local_adc = 0;
          local_ad8 = 0;
          local_ad4 = 0;
          local_ad0 = 0;
          local_ac8 = 0;
          local_b00 = (int *)0x0;
        }
        local_948 = 0;
      }
      else {
        local_87c = -100;
        local_948 = 1;
      }
      local_818 = &local_a98;
      local_6a0 = local_818;
      if (local_a90 != (int *)0x0) {
        local_6a4 = 0xffffffff;
        LOCK();
        local_6a8 = *local_a90;
        *local_a90 = *local_a90 + -1;
        UNLOCK();
        if (local_6a8 == 1) {
          if (local_a78 == (long *)0x0) {
            local_408 = local_a98;
            if (local_a98 != (void *)0x0) {
              free(local_a98);
            }
          }
          else {
            (**(code **)(*local_a78 + 0x18))(local_a78,local_a98);
          }
        }
      }
      local_a98 = (void *)0x0;
      local_a88 = 0;
      local_a80 = 0;
      local_a70 = 0;
      local_a6c = 0;
      local_a68 = 0;
      local_a64 = 0;
      local_a60 = 0;
      local_a58 = 0;
      local_a90 = (int *)0x0;
    }
    else {
      local_204 = local_8dc * local_8e0 * 0x10;
      local_218 = *(undefined8 *)(local_8b0 + 0x10);
      local_200 = &local_998;
      local_210 = 4;
      local_998 = (void *)0x0;
      local_990 = (int *)0x0;
      local_988 = 0;
      local_980 = 0;
      local_978 = (long *)0x0;
      local_970 = 0;
      local_96c = 0;
      local_968 = 0;
      local_964 = 0;
      local_960 = 0;
      local_958 = 0;
      Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff094,in_stack_fffffffffffff090),
                  (int)(in_stack_fffffffffffff088 >> 0x20),
                  CONCAT44(in_stack_fffffffffffff084,in_stack_fffffffffffff080),
                  (Allocator *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078));
      local_5c8 = &local_998;
      if (local_998 != (void *)0x0) {
        local_258 = local_5c8;
      }
      local_d99 = local_998 != (void *)0x0 && local_958 * local_960 != 0;
      if (local_d99) {
        for (local_99c = 0; local_99c < local_94c; local_99c = local_99c + 1) {
          local_9a0 = local_99c / local_8ec;
          local_9a4 = local_99c % local_8ec;
          local_9a8 = local_9a0 * local_8dc;
          local_9ac = local_9a4 * local_8e0;
          local_9b4 = local_8cc - local_9a8;
          piVar1 = std::min<int>(&local_9b4,&local_8dc);
          local_9b0 = *piVar1;
          local_9bc = local_8d0 - local_9ac;
          piVar1 = std::min<int>(&local_9bc,&local_8e0);
          local_9b8 = *piVar1;
          conv3x3s1_winograd23_transform_input_tile
                    (in_stack_000008f8,in_stack_000008f0,in_stack_000008ec,in_stack_000008e8,
                     in_stack_000008e4,in_stack_000008e0,in_stack_fffffffffffff070);
          local_4f4 = local_9a8 / local_8dc;
          local_4e8 = &local_a50;
          local_4f0 = &local_938;
          local_160 = (void *)((long)local_938 + local_8f8 * local_4f4 * local_928);
          local_148 = &local_a50;
          local_304 = local_9ac / local_8e0;
          local_2f8 = &local_a08;
          local_300 = &local_a50;
          local_2d8 = (void *)((long)local_160 +
                              (long)local_90c * (long)local_908 * (long)local_304 * local_928);
          local_2c8 = &local_a08;
          local_9c8 = (long)local_90c * (long)local_908;
          local_878 = &local_a50;
          local_9d0 = 1;
          local_9d4 = 1;
          local_9d8 = local_908;
          local_9dc = local_90c;
          local_9e0 = 2;
          local_9e8 = local_918;
          local_9f0 = local_920;
          local_9f8 = local_928;
          local_a00 = (int *)0x0;
          local_a30 = local_918;
          local_14c = local_90c;
          local_150 = local_908;
          local_154 = local_904;
          local_168 = local_928;
          local_16c = local_920;
          local_178 = local_918;
          local_2cc = local_90c;
          local_2d0 = local_908;
          local_2e0 = local_928;
          local_2e4 = local_920;
          local_2f0 = local_918;
          local_4f5 = 1;
          local_a50 = 0;
          local_a40 = 0;
          local_a38 = 0;
          local_a28 = 0;
          local_a24 = 0;
          local_a20 = 0;
          local_a1c = 0;
          local_a18 = 0;
          local_a10 = 0;
          local_a48 = 0;
          local_5e0 = local_878;
          local_a08 = local_2d8;
          transpose_pack_B_tile
                    ((Mat *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                     (Mat *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),(int)in_stack_ffffffffffffff48,
                     (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),(int)in_stack_ffffffffffffff40)
          ;
          local_868 = &local_a08;
          local_600 = local_868;
          if (local_a00 != (int *)0x0) {
            local_604 = 0xffffffff;
            LOCK();
            local_608 = *local_a00;
            *local_a00 = *local_a00 + -1;
            UNLOCK();
            if (local_608 == 1) {
              if (local_9e8 == (long *)0x0) {
                local_458 = local_a08;
                if (local_a08 != (void *)0x0) {
                  free(local_a08);
                }
              }
              else {
                (**(code **)(*local_9e8 + 0x18))(local_9e8,local_a08);
              }
            }
          }
          local_a08 = (void *)0x0;
          local_9f8 = 0;
          local_9f0 = 0;
          local_9e0 = 0;
          local_9dc = 0;
          local_9d8 = 0;
          local_9d4 = 0;
          local_9d0 = 0;
          local_9c8 = 0;
          local_a00 = (int *)0x0;
        }
        local_948 = 0;
      }
      else {
        local_87c = -100;
        local_948 = 1;
      }
      local_858 = &local_998;
      local_620 = local_858;
      if (local_990 != (int *)0x0) {
        local_624 = 0xffffffff;
        LOCK();
        local_628 = *local_990;
        *local_990 = *local_990 + -1;
        UNLOCK();
        if (local_628 == 1) {
          if (local_978 == (long *)0x0) {
            local_448 = local_998;
            if (local_998 != (void *)0x0) {
              free(local_998);
            }
          }
          else {
            (**(code **)(*local_978 + 0x18))(local_978,local_998);
          }
        }
      }
      local_998 = (void *)0x0;
      local_988 = 0;
      local_980 = 0;
      local_970 = 0;
      local_96c = 0;
      local_968 = 0;
      local_964 = 0;
      local_960 = 0;
      local_958 = 0;
      local_990 = (int *)0x0;
    }
    if (local_948 == 0) {
      local_344 = local_8dc * local_8d8 * 0x10;
      local_360 = *(undefined8 *)(local_8b0 + 0x10);
      local_340 = &local_be0;
      local_348 = 1;
      local_358 = 4;
      local_be0 = (void *)0x0;
      local_bd8 = (int *)0x0;
      local_bd0 = 0;
      local_bc8 = 0;
      local_bc0 = (long *)0x0;
      local_bb8 = 0;
      local_bb4 = 0;
      local_bb0 = 0;
      local_bac = 0;
      local_ba8 = 0;
      local_ba0 = 0;
      Mat::create(in_stack_fffffffffffff0a0,(int)((ulong)in_stack_fffffffffffff098 >> 0x20),
                  (int)in_stack_fffffffffffff098,in_stack_fffffffffffff094,in_stack_fffffffffffff088
                  ,(Allocator *)CONCAT44(in_stack_fffffffffffff084,in_stack_fffffffffffff080));
      local_5d8 = &local_be0;
      if (local_be0 != (void *)0x0) {
        local_248 = local_5d8;
      }
      local_ea1 = local_be0 != (void *)0x0 && local_ba0 * local_ba8 != 0;
      if (local_ea1) {
        for (local_be4 = 0; local_be4 < local_8e4; local_be4 = local_be4 + 1) {
          local_be8 = local_be4 * local_8d8;
          local_584 = get_omp_thread_num();
          local_578 = &local_c30;
          local_580 = &local_be0;
          local_c30 = (void *)((long)local_be0 + local_ba0 * local_584 * local_bd0);
          local_c28 = (int *)0x0;
          local_c20 = local_bd0;
          local_c18 = local_bc8;
          local_c10 = local_bc0;
          local_c04 = local_bb4;
          local_c00 = local_bb0;
          local_bfc = 1;
          local_bf8 = local_bac;
          local_bf0 = ((long)local_bb4 * (long)local_bb0 * local_bd0 + 0xf & 0xfffffffffffffff0) /
                      local_bd0;
          local_c08 = local_bb8 + -1;
          if (local_bb8 == 4) {
            local_bf0 = (long)local_bb4 * (long)local_bb0;
          }
          local_c4 = local_bc8;
          local_d0 = local_bc0;
          local_585 = 1;
          local_c38 = local_8c8 - local_be8;
          piVar1 = std::min<int>(&local_c38,&local_8d8);
          local_c34 = *piVar1;
          for (local_c3c = 0; local_c3c < local_8cc; local_c3c = local_8dc + local_c3c) {
            local_c44 = local_8cc - local_c3c;
            piVar1 = std::min<int>(&local_c44,&local_8dc);
            local_c40 = *piVar1;
            for (local_c48 = 0; local_c48 < local_8d0; local_c48 = local_8e0 + local_c48) {
              local_c50 = local_8d0 - local_c48;
              piVar1 = std::min<int>(&local_c50,&local_8e0);
              in_stack_fffffffffffff070 = *piVar1;
              local_4c4 = local_be8 / local_8d8;
              local_4b8 = &local_ce0;
              local_1bc = *(int *)((long)local_898 + 0x2c);
              local_1c0 = (int)local_898[6];
              local_18c = *(undefined4 *)((long)local_898 + 0x34);
              local_198 = *local_898 + local_898[8] * (long)local_4c4 * local_898[2];
              local_1d0 = local_898[2];
              local_1d4 = (undefined4)local_898[3];
              local_1e0 = (long *)local_898[4];
              local_180 = &local_ce0;
              local_1f4 = local_c48 / local_8e0;
              local_1e8 = &local_c98;
              local_1f0 = &local_ce0;
              local_1c8 = (void *)(local_198 +
                                  (long)local_1bc * (long)local_1c0 * (long)local_1f4 * local_1d0);
              local_1b8 = &local_c98;
              local_c58 = (long)local_1bc * (long)local_1c0;
              local_808 = &local_ce0;
              local_5b4 = local_c3c / local_8dc;
              local_5a8 = &local_d70;
              local_5b0 = &local_938;
              local_334 = local_c48 / local_8e0;
              local_328 = &local_d28;
              local_330 = &local_d70;
              local_278 = (void *)((long)local_938 +
                                  (long)local_90c * (long)local_908 * (long)local_334 * local_928 +
                                  local_8f8 * local_5b4 * local_928);
              local_268 = &local_d28;
              local_ce8 = (long)local_90c * (long)local_908;
              local_7f8 = &local_d70;
              local_c60 = 1;
              local_c64 = 1;
              local_c70 = 2;
              local_c90 = (int *)0x0;
              local_ca8 = 0;
              local_cac = 0;
              local_cb0 = 0;
              local_cb4 = 0;
              local_cc8 = 0;
              local_cd0 = 0;
              local_cd8 = 0;
              local_ce0 = 0;
              local_cf0 = 1;
              local_cf4 = 1;
              local_cf8 = local_908;
              local_cfc = local_90c;
              local_d00 = 2;
              local_d08 = local_918;
              local_d10 = local_920;
              local_d18 = local_928;
              local_d20 = (int *)0x0;
              local_d50 = local_918;
              local_26c = local_90c;
              local_270 = local_908;
              local_280 = local_928;
              local_284 = local_920;
              local_290 = local_918;
              local_4c5 = 1;
              local_5b5 = 1;
              local_ca0 = 0;
              local_cb8 = 0;
              local_d70 = 0;
              local_d60 = 0;
              local_d58 = 0;
              local_d48 = 0;
              local_d44 = 0;
              local_d40 = 0;
              local_d3c = 0;
              local_d38 = 0;
              local_d30 = 0;
              local_d68 = 0;
              local_c4c = in_stack_fffffffffffff070;
              local_6e0 = local_7f8;
              local_6c0 = local_808;
              local_1b0 = local_1e0;
              local_1a4 = local_1d4;
              local_1a0 = local_1d0;
              local_188 = local_1c0;
              local_184 = local_1bc;
              local_d28 = local_278;
              local_cc0 = local_1e0;
              local_c98 = local_1c8;
              local_c88 = local_1d0;
              local_c80 = local_1d4;
              local_c78 = local_1e0;
              local_c6c = local_1bc;
              local_c68 = local_1c0;
              gemm_transB_packed_tile
                        (in_stack_00000f30,in_stack_00000f28,in_stack_00000f20,in_stack_00000f1c,
                         in_stack_00000f18,in_stack_00000f14,in_stack_fffffffffffff070,
                         in_stack_fffffffffffff078);
              ppvVar2 = &local_d28;
              local_7e8 = ppvVar2;
              local_700 = ppvVar2;
              if (local_d20 != (int *)0x0) {
                local_704 = 0xffffffff;
                LOCK();
                local_708 = *local_d20;
                *local_d20 = *local_d20 + -1;
                UNLOCK();
                if (local_708 == 1) {
                  if (local_d08 == (long *)0x0) {
                    local_3d8 = local_d28;
                    if (local_d28 != (void *)0x0) {
                      free(local_d28);
                    }
                  }
                  else {
                    (**(code **)(*local_d08 + 0x18))(local_d08,local_d28);
                  }
                }
              }
              *ppvVar2 = (void *)0x0;
              ppvVar2[2] = (void *)0x0;
              *(undefined4 *)(ppvVar2 + 3) = 0;
              *(undefined4 *)(ppvVar2 + 5) = 0;
              *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
              *(undefined4 *)(ppvVar2 + 6) = 0;
              *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
              *(undefined4 *)(ppvVar2 + 7) = 0;
              ppvVar2[8] = (void *)0x0;
              ppvVar2[1] = (void *)0x0;
              ppvVar2 = &local_c98;
              local_7d8 = ppvVar2;
              local_720 = ppvVar2;
              if (local_c90 != (int *)0x0) {
                local_724 = 0xffffffff;
                LOCK();
                local_728 = *local_c90;
                *local_c90 = *local_c90 + -1;
                UNLOCK();
                if (local_728 == 1) {
                  if (local_c78 == (long *)0x0) {
                    local_3c8 = local_c98;
                    if (local_c98 != (void *)0x0) {
                      free(local_c98);
                    }
                  }
                  else {
                    (**(code **)(*local_c78 + 0x18))(local_c78,local_c98);
                  }
                }
              }
              *ppvVar2 = (void *)0x0;
              ppvVar2[2] = (void *)0x0;
              *(undefined4 *)(ppvVar2 + 3) = 0;
              *(undefined4 *)(ppvVar2 + 5) = 0;
              *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
              *(undefined4 *)(ppvVar2 + 6) = 0;
              *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
              *(undefined4 *)(ppvVar2 + 7) = 0;
              ppvVar2[8] = (void *)0x0;
              ppvVar2[1] = (void *)0x0;
            }
            conv3x3s1_winograd23_transform_output_tile
                      (in_stack_00000140,in_stack_00000138,in_stack_00000130,in_stack_0000012c,
                       in_stack_00000128,in_stack_00000124,in_stack_fffffffffffff070);
          }
          local_7c8 = &local_c30;
          local_740 = local_7c8;
          if (local_c28 != (int *)0x0) {
            local_744 = 0xffffffff;
            LOCK();
            local_748 = *local_c28;
            *local_c28 = *local_c28 + -1;
            UNLOCK();
            if (local_748 == 1) {
              if (local_c10 == (long *)0x0) {
                local_3b8 = local_c30;
                if (local_c30 != (void *)0x0) {
                  free(local_c30);
                }
              }
              else {
                (**(code **)(*local_c10 + 0x18))(local_c10,local_c30);
              }
            }
          }
          local_c30 = (void *)0x0;
          local_c20 = 0;
          local_c18 = 0;
          local_c08 = 0;
          local_c04 = 0;
          local_c00 = 0;
          local_bfc = 0;
          local_bf8 = 0;
          local_bf0 = 0;
          local_c28 = (int *)0x0;
        }
        local_87c = 0;
      }
      else {
        local_87c = -100;
      }
      local_948 = 1;
      ppvVar2 = &local_be0;
      local_7b8 = ppvVar2;
      local_760 = ppvVar2;
      if (local_bd8 != (int *)0x0) {
        local_764 = 0xffffffff;
        LOCK();
        local_768 = *local_bd8;
        *local_bd8 = *local_bd8 + -1;
        UNLOCK();
        if (local_768 == 1) {
          if (local_bc0 == (long *)0x0) {
            local_3a8 = local_be0;
            if (local_be0 != (void *)0x0) {
              free(local_be0);
            }
          }
          else {
            (**(code **)(*local_bc0 + 0x18))(local_bc0,local_be0);
          }
        }
      }
      *ppvVar2 = (void *)0x0;
      ppvVar2[2] = (void *)0x0;
      *(undefined4 *)(ppvVar2 + 3) = 0;
      *(undefined4 *)(ppvVar2 + 5) = 0;
      *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
      *(undefined4 *)(ppvVar2 + 6) = 0;
      *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
      *(undefined4 *)(ppvVar2 + 7) = 0;
      ppvVar2[8] = (void *)0x0;
      ppvVar2[1] = (void *)0x0;
    }
  }
  else {
    local_87c = -100;
    local_948 = 1;
  }
  ppvVar2 = &local_938;
  if (local_930 != (int *)0x0) {
    local_784 = 0xffffffff;
    LOCK();
    local_788 = *local_930;
    *local_930 = *local_930 + -1;
    UNLOCK();
    if (local_788 == 1) {
      local_7a8 = ppvVar2;
      local_780 = ppvVar2;
      if (local_918 == (long *)0x0) {
        local_398 = local_938;
        if (local_938 != (void *)0x0) {
          free(local_938);
        }
      }
      else {
        (**(code **)(*local_918 + 0x18))(local_918,local_938);
      }
    }
  }
  *ppvVar2 = (void *)0x0;
  ppvVar2[2] = (void *)0x0;
  *(undefined4 *)(ppvVar2 + 3) = 0;
  *(undefined4 *)(ppvVar2 + 5) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
  *(undefined4 *)(ppvVar2 + 6) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
  *(undefined4 *)(ppvVar2 + 7) = 0;
  ppvVar2[8] = (void *)0x0;
  ppvVar2[1] = (void *)0x0;
  return local_87c;
}

Assistant:

static int conv3x3s1_winograd23(const Mat& bottom_blob, Mat& top_blob, const Mat& AT, const Mat& bias, int nT, const Option& opt)
{
    int outw = top_blob.w;
    int outh = top_blob.h;

    // pad to 2n+2, winograd F(2,3)
    int w_tiles = (outw + 1) / 2;
    int h_tiles = (outh + 1) / 2;
    int tiles = w_tiles * h_tiles;

    const int M = top_blob.c * top_blob.elempack;
    const int N = tiles;
    const int K = bottom_blob.c * bottom_blob.elempack;
    const int B = 16;

    // NCNN_LOGE("conv3x3s1_winograd23 %d %d %d", M, N, K);

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, N, K, TILE_M, TILE_N, TILE_K, nT);

    const int nn_M = (M + TILE_M - 1) / TILE_M;
    const int nn_N = (N + TILE_N - 1) / TILE_N;
    const int nn_K = (K + TILE_K - 1) / TILE_K;

    // NCNN_LOGE("TILE M/N/K = %d %d %d -> %d %d %d", M, N, K, TILE_M, TILE_N, TILE_K);

    Mat BT(TILE_K * TILE_N, B, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 4u, opt.workspace_allocator);
    if (BT.empty())
        return -100;

    const int nn_NK = nn_N * nn_K;

    if (nT > 1 && nn_NK < nT)
    {
        Mat B_tile(TILE_N * B * TILE_K, 4u, opt.workspace_allocator);
        if (B_tile.empty())
            return -100;

        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            // transform input
            conv3x3s1_winograd23_transform_input_tile(bottom_blob, B_tile, j, max_jj, k, max_kk, nT);

            Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

            transpose_pack_B_tile(B_tile, BT_tile, B, max_jj, max_kk, nT);
        }
    }
    else
    {
        Mat B_tileX(TILE_N * B * TILE_K, 1, nT, 4u, opt.workspace_allocator);
        if (B_tileX.empty())
            return -100;

        #pragma omp parallel for num_threads(nT)
        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            Mat B_tile = B_tileX.channel(get_omp_thread_num());

            // transform input
            conv3x3s1_winograd23_transform_input_tile(bottom_blob, B_tile, j, max_jj, k, max_kk, 1);

            Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

            transpose_pack_B_tile(B_tile, BT_tile, B, max_jj, max_kk, 1);
        }
    }

    Mat top_tileX(TILE_N * B * TILE_M, 1, nT, 4u, opt.workspace_allocator);
    if (top_tileX.empty())
        return -100;

    #pragma omp parallel for num_threads(nT)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        Mat top_tile = top_tileX.channel(get_omp_thread_num());

        const int max_ii = std::min((M - i), TILE_M);

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                const Mat AT_tile = AT.channel(i / TILE_M).depth(k / TILE_K);

                const Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

                gemm_transB_packed_tile(AT_tile, BT_tile, top_tile, B, max_ii, max_jj, k, max_kk);
            }

            // transform output
            conv3x3s1_winograd23_transform_output_tile(top_tile, top_blob, bias, i, max_ii, j, max_jj);
        }
    }

    return 0;
}